

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O1

UpVal * luaF_findupval(lua_State *L,StkId level)

{
  UpVal *pUVar1;
  UpVal *pUVar2;
  TValue *pTVar3;
  anon_union_16_2_5131162a_for_u *paVar4;
  
  paVar4 = (anon_union_16_2_5131162a_for_u *)&L->openupval;
  pUVar1 = L->openupval;
  if ((pUVar1 != (UpVal *)0x0) && (pTVar3 = pUVar1->v, level <= pTVar3)) {
    do {
      pUVar2 = pUVar1;
      if (pTVar3 == level) {
        return pUVar2;
      }
      pUVar1 = (pUVar2->u).open.next;
    } while ((pUVar1 != (UpVal *)0x0) && (pTVar3 = pUVar1->v, level <= pTVar3));
    paVar4 = &pUVar2->u;
  }
  pUVar1 = (UpVal *)luaM_realloc_(L,(void *)0x0,0,0x20);
  pUVar1->refcount = 0;
  (pUVar1->u).open.next = (paVar4->open).next;
  (pUVar1->u).open.touched = 1;
  (paVar4->open).next = pUVar1;
  pUVar1->v = level;
  if (L->twups == L) {
    L->twups = L->l_G->twups;
    L->l_G->twups = L;
  }
  return pUVar1;
}

Assistant:

UpVal *luaF_findupval (lua_State *L, StkId level) {
  UpVal **pp = &L->openupval;
  UpVal *p;
  lua_assert(isintwups(L) || L->openupval == NULL);
  while ((p = *pp) != NULL && uplevel(p) >= level) {  /* search for it */
    lua_assert(!isdead(G(L), p));
    if (uplevel(p) == level)  /* corresponding upvalue? */
      return p;  /* return it */
    pp = &p->u.open.next;
  }
  /* not found: create a new upvalue after 'pp' */
  return newupval(L, 0, level, pp);
}